

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender __thiscall
fmt::v8::detail::write<char,fmt::v8::appender>
          (detail *this,appender out,basic_string_view<char> s,basic_format_specs<char> *specs)

{
  type tVar1;
  appender aVar2;
  char *n;
  basic_string_view<char> s_00;
  size_t local_88;
  anon_class_16_2_3f014a30 local_80;
  size_t local_70;
  string_view local_68;
  size_t local_58;
  size_t width;
  char *local_48;
  ulong local_40;
  size_t size;
  char *data;
  basic_format_specs<char> *specs_local;
  basic_string_view<char> s_local;
  appender out_local;
  
  n = (char *)s.size_;
  s_local.data_ = s.data_;
  data = n;
  specs_local = (basic_format_specs<char> *)
                out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
  s_local.size_ = (size_t)this;
  size = (size_t)basic_string_view<char>::data((basic_string_view<char> *)&specs_local);
  local_40 = basic_string_view<char>::size((basic_string_view<char> *)&specs_local);
  if (-1 < *(int *)(data + 4)) {
    tVar1 = to_unsigned<int>(*(int *)(data + 4));
    if (tVar1 < local_40) {
      width = (size_t)specs_local;
      local_48 = s_local.data_;
      tVar1 = to_unsigned<int>(*(int *)(data + 4));
      s_00.size_._0_4_ = tVar1;
      s_00.data_ = local_48;
      s_00.size_._4_4_ = 0;
      local_40 = code_point_index<char>((detail *)width,s_00,(size_t)n);
    }
  }
  if (*(int *)data == 0) {
    local_88 = 0;
  }
  else {
    basic_string_view<char>::basic_string_view(&local_68,(char *)size,local_40);
    local_88 = compute_width(local_68);
  }
  local_58 = local_88;
  local_70 = s_local.size_;
  local_80.data = (char *)size;
  local_80.size = local_40;
  aVar2 = write_padded<(fmt::v8::align::type)1,fmt::v8::appender,char,fmt::v8::detail::write<char,fmt::v8::appender>(fmt::v8::appender,fmt::v8::basic_string_view<char>,fmt::v8::basic_format_specs<char>const&)::_lambda(fmt::v8::appender)_1_>
                    ((appender)s_local.size_,(basic_format_specs<char> *)data,local_40,local_88,
                     &local_80);
  return (appender)
         aVar2.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
}

Assistant:

FMT_CONSTEXPR auto write(OutputIt out, basic_string_view<Char> s,
                         const basic_format_specs<Char>& specs) -> OutputIt {
  auto data = s.data();
  auto size = s.size();
  if (specs.precision >= 0 && to_unsigned(specs.precision) < size)
    size = code_point_index(s, to_unsigned(specs.precision));
  auto width =
      specs.width != 0 ? compute_width(basic_string_view<Char>(data, size)) : 0;
  return write_padded(out, specs, size, width,
                      [=](reserve_iterator<OutputIt> it) {
                        return copy_str<Char>(data, data + size, it);
                      });
}